

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O1

void __thiscall ASN1Test_StringToUTF8_Test::TestBody(ASN1Test_StringToUTF8_Test *this)

{
  pointer data;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  internal iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  char *in_R9;
  int *message;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  initializer_list<unsigned_char> __l_08;
  initializer_list<unsigned_char> __l_09;
  initializer_list<unsigned_char> __l_10;
  initializer_list<unsigned_char> __l_11;
  initializer_list<unsigned_char> __l_12;
  initializer_list<unsigned_char> __l_13;
  initializer_list<unsigned_char> __l_14;
  initializer_list<unsigned_char> __l_15;
  AssertionResult gtest_ar_;
  uint8_t *utf8;
  AssertionResult gtest_ar;
  ScopedTrace gtest_trace_918;
  ScopedTrace gtest_trace_917;
  UniquePtr<ASN1_STRING> s;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  AssertHelper local_b0;
  Bytes local_a8;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  allocator_type local_72;
  uchar local_71;
  allocator_type local_70;
  allocator_type local_6f;
  allocator_type local_6e;
  allocator_type local_6d;
  allocator_type local_6c;
  undefined4 local_6b;
  allocator_type local_67;
  undefined4 local_66;
  allocator_type local_62;
  allocator_type local_61;
  allocator_type local_60;
  allocator_type local_5f;
  allocator_type local_5e;
  allocator_type local_5d;
  allocator_type local_5c;
  allocator_type local_5b;
  allocator_type local_5a;
  allocator_type local_59;
  unique_ptr<asn1_string_st,_bssl::internal::Deleter> local_58;
  uchar local_4e [30];
  
  if ((TestBody()::kTests == '\0') && (iVar2 = __cxa_guard_acquire(&TestBody()::kTests), iVar2 != 0)
     ) {
    local_4e[0] = 0xc0;
    local_4e[1] = 0x81;
    __l._M_len = 2;
    __l._M_array = local_4e;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0].in,__l,&local_59);
    TestBody::kTests[0].type = 0xc;
    TestBody::kTests[0].expected = (char *)0x0;
    local_4e[0xb] = 0xe0;
    local_4e[0xc] = 0x80;
    local_4e[0xd] = 0x81;
    __l_00._M_len = 3;
    __l_00._M_array = local_4e + 0xb;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[1].in,__l_00,&local_5a);
    TestBody::kTests[1].type = 0xc;
    TestBody::kTests[1].expected = (char *)0x0;
    local_a8.span_.data_ = (uchar *)CONCAT44(local_a8.span_.data_._4_4_,0x818080f0);
    __l_01._M_len = 4;
    __l_01._M_array = (iterator)&local_a8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[2].in,__l_01,&local_5b);
    TestBody::kTests[2].type = 0xc;
    TestBody::kTests[2].expected = (char *)0x0;
    local_4e[8] = 0xf0;
    local_4e[9] = 0x80;
    local_4e[10] = 0x80;
    __l_02._M_len = 3;
    __l_02._M_array = local_4e + 8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[3].in,__l_02,&local_5c);
    TestBody::kTests[3].type = 0xc;
    TestBody::kTests[3].expected = (char *)0x0;
    local_4e[5] = 0xed;
    local_4e[6] = 0xa0;
    local_4e[7] = 0x80;
    __l_03._M_len = 3;
    __l_03._M_array = local_4e + 5;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[4].in,__l_03,&local_5d);
    TestBody::kTests[4].type = 0xc;
    TestBody::kTests[4].expected = (char *)0x0;
    local_4e[2] = 0xed;
    local_4e[3] = 0xb0;
    local_4e[4] = 0x81;
    __l_04._M_len = 3;
    __l_04._M_array = local_4e + 2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[5].in,__l_04,&local_5e);
    TestBody::kTests[5].type = 0xc;
    TestBody::kTests[5].expected = (char *)0x0;
    local_58._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl._0_4_ = 0x5800fffe;
    __l_05._M_len = 4;
    __l_05._M_array = (iterator)&local_58;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[6].in,__l_05,&local_5f);
    TestBody::kTests[6].type = 0x1e;
    TestBody::kTests[6].expected = (char *)0x0;
    local_98 = (undefined1  [8])0x58000000fffe0000;
    __l_06._M_len = 8;
    __l_06._M_array = local_98;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[7].in,__l_06,&local_60);
    TestBody::kTests[7].type = 0x1c;
    TestBody::kTests[7].expected = (char *)0x0;
    local_b0.data_._0_4_ = 0xfffe5800;
    __l_07._M_len = 4;
    __l_07._M_array = (iterator)&local_b0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[8].in,__l_07,&local_61);
    TestBody::kTests[8].type = 0x1e;
    TestBody::kTests[8].expected = anon_var_dwarf_4110b;
    local_c0 = (undefined1  [8])0xfffe000058000000;
    __l_08._M_len = 8;
    __l_08._M_array = local_c0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[9].in,__l_08,&local_62);
    TestBody::kTests[9].type = 0x1c;
    TestBody::kTests[9].expected = anon_var_dwarf_4110b;
    local_66 = 0xfdff1000;
    __l_09._M_len = 4;
    __l_09._M_array = (iterator)&local_66;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[10].in,__l_09,&local_67);
    TestBody::kTests[10].type = 0x1c;
    TestBody::kTests[10].expected = anon_var_dwarf_41118;
    local_6b = 0x1100;
    __l_10._M_len = 4;
    __l_10._M_array = (iterator)&local_6b;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xb].in,__l_10,&local_6c);
    TestBody::kTests[0xb].type = 0x1c;
    TestBody::kTests[0xb].expected = (char *)0x0;
    local_4e[0x1a] = '\0';
    local_4e[0x1b] = '\x01';
    local_4e[0x1c] = 0xff;
    local_4e[0x1d] = 0xff;
    __l_11._M_len = 4;
    __l_11._M_array = local_4e + 0x1a;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xc].in,__l_11,&local_6d);
    TestBody::kTests[0xc].type = 0x1c;
    TestBody::kTests[0xc].expected = (char *)0x0;
    local_4e[0x16] = '\0';
    local_4e[0x17] = '\x01';
    local_4e[0x18] = 0xff;
    local_4e[0x19] = 0xfe;
    __l_12._M_len = 4;
    __l_12._M_array = local_4e + 0x16;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xd].in,__l_12,&local_6e);
    TestBody::kTests[0xd].type = 0x1c;
    TestBody::kTests[0xd].expected = (char *)0x0;
    local_4e[0x12] = '\0';
    local_4e[0x13] = '\0';
    local_4e[0x14] = 0xfd;
    local_4e[0x15] = 0xd5;
    __l_13._M_len = 4;
    __l_13._M_array = local_4e + 0x12;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xe].in,__l_13,&local_6f);
    TestBody::kTests[0xe].type = 0x1c;
    TestBody::kTests[0xe].expected = (char *)0x0;
    local_4e[0xe] = 0xd8;
    local_4e[0xf] = '\0';
    local_4e[0x10] = 0xdc;
    local_4e[0x11] = '\x01';
    __l_14._M_len = 4;
    __l_14._M_array = local_4e + 0xe;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0xf].in,__l_14,&local_70);
    TestBody::kTests[0xf].type = 0x1e;
    TestBody::kTests[0xf].expected = (char *)0x0;
    local_71 = '\x01';
    __l_15._M_len = 1;
    __l_15._M_array = &local_71;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&TestBody::kTests[0x10].in,__l_15,&local_72);
    TestBody::kTests[0x10].type = 2;
    TestBody::kTests[0x10].expected = (char *)0x0;
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&TestBody()::kTests);
  }
  message = &TestBody::kTests[0].type;
  lVar4 = 0x2a8;
  do {
    local_98 = (undefined1  [8])
               (((anon_struct_40_3_dfaa98aa *)(message + -6))->in).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(pointer *)(message + -4) + -(long)local_98);
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_66,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x395,(Bytes *)local_98);
    testing::ScopedTrace::ScopedTrace<int>
              ((ScopedTrace *)&local_6b,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x396,message);
    local_58._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
         ASN1_STRING_type_new(*message);
    iVar1 = (internal)
            ((tuple<asn1_string_st_*,_bssl::internal::Deleter>)
             local_58._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
            (_Head_base<0UL,_asn1_string_st_*,_false>)0x0);
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_c0[0] = iVar1;
    if ((tuple<asn1_string_st_*,_bssl::internal::Deleter>)
        local_58._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_c0,(AssertionResult *)0x5b4e1d,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x398,(char *)local_98);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
LAB_001ca9e8:
      testing::internal::AssertHelper::~AssertHelper(&local_b0);
      if (local_98 != (undefined1  [8])&local_88) {
        operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
      }
      if ((long *)local_a8.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_a8.span_.data_ + 8))();
      }
      if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
      }
      std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&local_58);
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_6b);
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_66);
      return;
    }
    data = (((anon_struct_40_3_dfaa98aa *)(message + -6))->in).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
    iVar2 = ASN1_STRING_set((ASN1_STRING *)
                            local_58._M_t.
                            super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,data,
                            (int)*(pointer *)(message + -4) - (int)data);
    local_c0[0] = (internal)(iVar2 != 0);
    local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)local_c0,
                 (AssertionResult *)"ASN1_STRING_set(s.get(), test.in.data(), test.in.size())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x399,(char *)local_98);
      testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_a8);
      goto LAB_001ca9e8;
    }
    uVar3 = ASN1_STRING_to_UTF8((uchar **)&local_b0,
                                (ASN1_STRING *)
                                local_58._M_t.
                                super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl);
    local_c0[0] = (internal)(byte)(uVar3 >> 0x1f);
    local_a8.span_.data_ =
         (uchar *)CONCAT71(local_a8.span_.data_._1_7_,*(char **)(message + 2) == (char *)0x0);
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)local_98,"utf8_len < 0","test.expected == nullptr",(bool *)local_c0,
               (bool *)&local_a8);
    if (local_98[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_c0);
      pcVar5 = "";
      if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = (local_90->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x39d,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
      if (local_c0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c0 + 8))();
      }
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
    if ((int)uVar3 < 0) {
      ERR_clear_error();
    }
    else {
      __s = *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (message + 2);
      if (__s != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   strlen((char *)__s);
        local_a8.span_.data_ = (uchar *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_);
        local_a8.span_.size_ = (size_t)uVar3;
        local_c0 = (undefined1  [8])__s;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)local_98,"Bytes(test.expected)","Bytes(utf8, utf8_len)",
                   (Bytes *)local_c0,&local_a8);
        if (local_98[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_c0);
          pcVar5 = "";
          if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_90->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x3a0,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
          if (local_c0 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_c0 + 8))();
          }
        }
        if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_90,local_90);
        }
      }
      OPENSSL_free((void *)CONCAT44(local_b0.data_._4_4_,local_b0.data_._0_4_));
    }
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&local_58);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_6b);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_66);
    message = message + 10;
    lVar4 = lVar4 + -0x28;
    if (lVar4 == 0) {
      return;
    }
  } while( true );
}

Assistant:

TEST(ASN1Test, StringToUTF8) {
  static const struct {
    std::vector<uint8_t> in;
    int type;
    const char *expected;
  } kTests[] = {
      // Non-minimal, two-byte UTF-8.
      {{0xc0, 0x81}, V_ASN1_UTF8STRING, nullptr},
      // Non-minimal, three-byte UTF-8.
      {{0xe0, 0x80, 0x81}, V_ASN1_UTF8STRING, nullptr},
      // Non-minimal, four-byte UTF-8.
      {{0xf0, 0x80, 0x80, 0x81}, V_ASN1_UTF8STRING, nullptr},
      // Truncated, four-byte UTF-8.
      {{0xf0, 0x80, 0x80}, V_ASN1_UTF8STRING, nullptr},
      // Low-surrogate value.
      {{0xed, 0xa0, 0x80}, V_ASN1_UTF8STRING, nullptr},
      // High-surrogate value.
      {{0xed, 0xb0, 0x81}, V_ASN1_UTF8STRING, nullptr},
      // Initial BOMs should be rejected from UCS-2 and UCS-4.
      {{0xfe, 0xff, 0, 88}, V_ASN1_BMPSTRING, nullptr},
      {{0, 0, 0xfe, 0xff, 0, 0, 0, 88}, V_ASN1_UNIVERSALSTRING, nullptr},
      // Otherwise, BOMs should pass through.
      {{0, 88, 0xfe, 0xff}, V_ASN1_BMPSTRING, "X\xef\xbb\xbf"},
      {{0, 0, 0, 88, 0, 0, 0xfe, 0xff},
       V_ASN1_UNIVERSALSTRING,
       "X\xef\xbb\xbf"},
      // The maximum code-point should pass though.
      {{0, 16, 0xff, 0xfd}, V_ASN1_UNIVERSALSTRING, "\xf4\x8f\xbf\xbd"},
      // Values outside the Unicode space should not.
      {{0, 17, 0, 0}, V_ASN1_UNIVERSALSTRING, nullptr},
      // Non-characters should be rejected.
      {{0, 1, 0xff, 0xff}, V_ASN1_UNIVERSALSTRING, nullptr},
      {{0, 1, 0xff, 0xfe}, V_ASN1_UNIVERSALSTRING, nullptr},
      {{0, 0, 0xfd, 0xd5}, V_ASN1_UNIVERSALSTRING, nullptr},
      // BMPString is UCS-2, not UTF-16, so surrogate pairs are invalid.
      {{0xd8, 0, 0xdc, 1}, V_ASN1_BMPSTRING, nullptr},
      // INTEGERs are stored as strings, but cannot be converted to UTF-8.
      {{0x01}, V_ASN1_INTEGER, nullptr},
  };

  for (const auto &test : kTests) {
    SCOPED_TRACE(Bytes(test.in));
    SCOPED_TRACE(test.type);
    bssl::UniquePtr<ASN1_STRING> s(ASN1_STRING_type_new(test.type));
    ASSERT_TRUE(s);
    ASSERT_TRUE(ASN1_STRING_set(s.get(), test.in.data(), test.in.size()));

    uint8_t *utf8;
    const int utf8_len = ASN1_STRING_to_UTF8(&utf8, s.get());
    EXPECT_EQ(utf8_len < 0, test.expected == nullptr);
    if (utf8_len >= 0) {
      if (test.expected != nullptr) {
        EXPECT_EQ(Bytes(test.expected), Bytes(utf8, utf8_len));
      }
      OPENSSL_free(utf8);
    } else {
      ERR_clear_error();
    }
  }
}